

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::load(Compiler *this,SchemaLoader *loader,uint64_t id)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> LStack_28;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&LStack_28,
             &this->impl);
  Impl::loadFinal((LStack_28.ptr)->ptr,loader,id);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&LStack_28);
  return;
}

Assistant:

void Compiler::load(const SchemaLoader& loader, uint64_t id) const {
  impl.lockExclusive()->get()->loadFinal(loader, id);
}